

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

Vec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::getPixel
          (LayeredImage *this,int x,int y,int z)

{
  TextureFormat *pTVar1;
  undefined4 in_register_00000034;
  LayeredImage *this_00;
  int in_R8D;
  Vec4 VVar2;
  TextureFormat local_80;
  TextureFormat local_78;
  ChannelOrder local_70;
  int local_6c [2];
  ChannelType local_64;
  TextureFormat local_60;
  undefined1 local_58 [16];
  ChannelOrder local_48;
  int local_44 [2];
  ChannelType local_3c;
  TextureFormat local_38;
  
  this_00 = (LayeredImage *)CONCAT44(in_register_00000034,x);
  if (this_00->m_type == TEXTURETYPE_CUBE) {
    pTVar1 = (TextureFormat *)
             ((this_00->m_texCube).m_ptr)->m_access
             [(uint)(&(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)[in_R8D]].
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_58._0_8_ = *pTVar1;
    local_78 = pTVar1[1];
    local_38 = pTVar1[4];
    local_70 = pTVar1[2].order;
    local_6c = *(int (*) [2])&pTVar1[2].type;
    local_64 = pTVar1[3].type;
  }
  else {
    getAccessInternal((PixelBufferAccess *)local_58,this_00);
    local_78.order = local_58._8_4_;
    local_78.type = local_58._12_4_;
    local_70 = local_48;
    local_6c[0] = local_44[0];
    local_6c[1] = local_44[1];
    local_64 = local_3c;
  }
  local_80 = (TextureFormat)local_58._0_8_;
  local_60 = local_38;
  VVar2 = tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)this,(int)&local_80,y,z);
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 LayeredImage::getPixel (int x, int y, int z) const
{
	const ConstPixelBufferAccess access = m_type == TEXTURETYPE_CUBE ? getCubeFaceAccess(glslImageFuncZToCubeFace(z)) : getAccess();
	return access.getPixel(x, y, m_type == TEXTURETYPE_CUBE ? 0 : z);
}